

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

void kname(Proto *p,int pc,int c,char **name)

{
  char *pcVar1;
  char *what;
  TValue *kvalue;
  char **name_local;
  int c_local;
  int pc_local;
  Proto *p_local;
  
  if ((c & 0x100U) == 0) {
    pcVar1 = getobjname(p,pc,c,name);
    if ((pcVar1 != (char *)0x0) && (*pcVar1 == 'c')) {
      return;
    }
  }
  else if ((p->k[(int)(c & 0xfffffeff)].tt_ & 0xfU) == 4) {
    *name = (char *)(p->k[(int)(c & 0xfffffeff)].value_.f + 0x18);
    return;
  }
  *name = "?";
  return;
}

Assistant:

static void kname (Proto *p, int pc, int c, const char **name) {
  if (ISK(c)) {  /* is 'c' a constant? */
    TValue *kvalue = &p->k[INDEXK(c)];
    if (ttisstring(kvalue)) {  /* literal constant? */
      *name = svalue(kvalue);  /* it is its own name */
      return;
    }
    /* else no reasonable name found */
  }
  else {  /* 'c' is a register */
    const char *what = getobjname(p, pc, c, name); /* search for 'c' */
    if (what && *what == 'c') {  /* found a constant name? */
      return;  /* 'name' already filled */
    }
    /* else no reasonable name found */
  }
  *name = "?";  /* no reasonable name found */
}